

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O2

cJSON_bool print_number(cJSON *item,printbuffer *output_buffer)

{
  double b;
  long lVar1;
  uchar uVar2;
  uint uVar3;
  int iVar4;
  cJSON_bool cVar5;
  uchar *puVar6;
  ulong uVar7;
  uchar uVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  double test;
  uchar number_buffer [26];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  b = item->valuedouble;
  number_buffer._16_10_ = SUB1610((undefined1  [16])0x0,6);
  number_buffer[0] = '\0';
  number_buffer[1] = '\0';
  number_buffer[2] = '\0';
  number_buffer[3] = '\0';
  number_buffer[4] = '\0';
  number_buffer[5] = '\0';
  number_buffer[6] = '\0';
  number_buffer[7] = '\0';
  number_buffer[8] = '\0';
  number_buffer[9] = '\0';
  number_buffer[10] = '\0';
  number_buffer[0xb] = '\0';
  number_buffer[0xc] = '\0';
  number_buffer[0xd] = '\0';
  number_buffer[0xe] = '\0';
  number_buffer[0xf] = '\0';
  uVar2 = get_decimal_point();
  test = 0.0;
  cVar5 = 0;
  if (output_buffer == (printbuffer *)0x0) goto LAB_00105a16;
  if ((ulong)ABS(b) < 0x7ff0000000000000) {
    uVar3 = sprintf((char *)number_buffer,"%1.15g",b);
    iVar4 = __isoc99_sscanf(number_buffer,"%lg",&test);
    if (iVar4 == 1) {
      cVar5 = compare_double(test,b);
      if (cVar5 == 0) goto LAB_001059b0;
    }
    else {
LAB_001059b0:
      uVar3 = sprintf((char *)number_buffer,"%1.17g",b);
    }
    cVar5 = 0;
    if (0x19 < uVar3) goto LAB_00105a16;
  }
  else {
    builtin_memcpy(number_buffer,"null",5);
    uVar3 = 4;
  }
  uVar9 = (ulong)uVar3;
  puVar6 = ensure(output_buffer,uVar9 + 1);
  cVar5 = 0;
  if (puVar6 != (uchar *)0x0) {
    for (uVar7 = 0; uVar9 != uVar7; uVar7 = uVar7 + 1) {
      uVar8 = number_buffer[uVar7];
      if (uVar8 == uVar2) {
        uVar8 = '.';
      }
      puVar6[uVar7] = uVar8;
    }
    puVar6[uVar9] = '\0';
    output_buffer->offset = output_buffer->offset + uVar9;
    cVar5 = 1;
  }
LAB_00105a16:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return cVar5;
  }
  __stack_chk_fail();
}

Assistant:

static cJSON_bool print_number(const cJSON * const item, printbuffer * const output_buffer)
{
    unsigned char *output_pointer = NULL;
    double d = item->valuedouble;
    int length = 0;
    size_t i = 0;
    unsigned char number_buffer[26] = {0}; /* temporary buffer to print the number into */
    unsigned char decimal_point = get_decimal_point();
    double test = 0.0;

    if (output_buffer == NULL)
    {
        return false;
    }

    /* This checks for NaN and Infinity */
    if (isnan(d) || isinf(d))
    {
        length = sprintf((char*)number_buffer, "null");
    }
    else
    {
        /* Try 15 decimal places of precision to avoid nonsignificant nonzero digits */
        length = sprintf((char*)number_buffer, "%1.15g", d);

        /* Check whether the original double can be recovered */
        if ((sscanf((char*)number_buffer, "%lg", &test) != 1) || !compare_double((double)test, d))
        {
            /* If not, print with 17 decimal places of precision */
            length = sprintf((char*)number_buffer, "%1.17g", d);
        }
    }

    /* sprintf failed or buffer overrun occurred */
    if ((length < 0) || (length > (int)(sizeof(number_buffer) - 1)))
    {
        return false;
    }

    /* reserve appropriate space in the output */
    output_pointer = ensure(output_buffer, (size_t)length + sizeof(""));
    if (output_pointer == NULL)
    {
        return false;
    }

    /* copy the printed number to the output and replace locale
     * dependent decimal point with '.' */
    for (i = 0; i < ((size_t)length); i++)
    {
        if (number_buffer[i] == decimal_point)
        {
            output_pointer[i] = '.';
            continue;
        }

        output_pointer[i] = number_buffer[i];
    }
    output_pointer[i] = '\0';

    output_buffer->offset += (size_t)length;

    return true;
}